

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateMergingCode
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  ImmutableEnumFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(pFVar2);
  if (bVar1) {
    io::Printer::Print(local_18,&this->variables_,
                       "if (other.has$capitalized_name$()) {\n  set$capitalized_name$(other.get$capitalized_name$());\n}\n"
                      );
  }
  else {
    pFVar2 = FieldDescriptor::file(this->descriptor_);
    bVar1 = SupportUnknownEnumValue(pFVar2);
    if (bVar1) {
      io::Printer::Print(local_18,&this->variables_,
                         "if (other.$name$_ != $default_number$) {\n  set$capitalized_name$Value(other.get$capitalized_name$Value());\n}\n"
                        );
    }
    else {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_enum_field.cc"
                 ,0x11f);
      other = internal::LogMessage::operator<<(&local_50,"Can\'t reach here.");
      internal::LogFinisher::operator=(local_5d,other);
      internal::LogMessage::~LogMessage(&local_50);
    }
  }
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "if (other.has$capitalized_name$()) {\n"
      "  set$capitalized_name$(other.get$capitalized_name$());\n"
      "}\n");
  } else if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "if (other.$name$_ != $default_number$) {\n"
      "  set$capitalized_name$Value(other.get$capitalized_name$Value());\n"
      "}\n");
  } else {
    GOOGLE_LOG(FATAL) << "Can't reach here.";
  }
}